

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeConstraint.cpp
# Opt level: O0

void __thiscall UnitTest::TimeConstraint::~TimeConstraint(TimeConstraint *this)

{
  TestResults *this_00;
  TestDetails *test;
  ostream *poVar1;
  TestResults **ppTVar2;
  char *failure;
  undefined1 local_1b0 [8];
  MemoryOutStream stream;
  double totalTimeInMs;
  TimeConstraint *this_local;
  
  stream._400_8_ = Timer::GetTimeInMs(&this->m_timer);
  if ((double)this->m_maxMs < (double)stream._400_8_) {
    MemoryOutStream::MemoryOutStream((MemoryOutStream *)local_1b0);
    poVar1 = std::operator<<((ostream *)local_1b0,
                             "Time constraint failed. Expected to run test under ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_maxMs);
    poVar1 = std::operator<<(poVar1,"ms but took ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(double)stream._400_8_);
    std::operator<<(poVar1,"ms.");
    ppTVar2 = CurrentTest::Results();
    this_00 = *ppTVar2;
    test = this->m_details;
    failure = MemoryOutStream::GetText((MemoryOutStream *)local_1b0);
    TestResults::OnTestFailure(this_00,test,failure);
    MemoryOutStream::~MemoryOutStream((MemoryOutStream *)local_1b0);
  }
  return;
}

Assistant:

TimeConstraint::~TimeConstraint()
{
    double const totalTimeInMs = m_timer.GetTimeInMs();
    if (totalTimeInMs > m_maxMs)
    {
        MemoryOutStream stream;
        stream << "Time constraint failed. Expected to run test under " << m_maxMs <<
                  "ms but took " << totalTimeInMs << "ms.";

		UnitTest::CurrentTest::Results()->OnTestFailure(m_details, stream.GetText());
    }
}